

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O1

void __thiscall test::FunctionTimer::Print(FunctionTimer *this,uint trials)

{
  ostringstream *poVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined1 auVar4 [16];
  OutputWorker *pOVar5;
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar8 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar9 [16];
  undefined1 local_1b0 [392];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  if (trials == 1) {
    if (2 < DAT_001bd6d8) {
      return;
    }
    auVar9 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,this->TotalUsec);
    auVar7 = vcvtusi2sd_avx512f(in_ZMM1._0_16_,this->Invokations);
    poVar1 = (ostringstream *)(local_1b0 + 0x10);
    local_1b0._0_8_ = Logger;
    local_1b0._8_4_ = Info;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(this->FunctionName)._M_dataplus._M_p,
               (this->FunctionName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," called ",8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," times.  ",9);
    std::ostream::_M_insert<double>(auVar9._0_8_ / auVar7._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," usec avg for all invokations.  ",0x20);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," usec",5);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_1b0);
  }
  else {
    if (2 < DAT_001bd6d8) {
      return;
    }
    uVar2 = this->Invokations;
    uVar3 = this->TotalUsec;
    poVar1 = (ostringstream *)(local_1b0 + 0x10);
    local_1b0._0_8_ = Logger;
    local_1b0._8_4_ = Info;
    auVar9 = std::__cxx11::ostringstream::ostringstream(poVar1);
    auVar8._0_8_ = auVar9._8_8_;
    auVar6._0_8_ = auVar9._0_8_;
    auVar8._8_56_ = extraout_var_00;
    auVar7 = auVar8._0_16_;
    auVar6._8_56_ = extraout_var;
    auVar9 = auVar6._0_16_;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,DAT_001bd708,DAT_001bd710);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,(this->FunctionName)._M_dataplus._M_p,
               (this->FunctionName)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," called ",8);
    auVar9 = vcvtusi2ss_avx512f(auVar9,uVar2);
    auVar4 = vcvtusi2ss_avx512f(auVar7,trials);
    std::ostream::_M_insert<double>((double)(auVar9._0_4_ / auVar4._0_4_));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," times per trial (avg).  ",0x19);
    auVar9 = vcvtusi2sd_avx512f(in_XMM2,uVar3);
    auVar7 = vcvtusi2sd_avx512f(in_XMM2,uVar2);
    std::ostream::_M_insert<double>(auVar9._0_8_ / auVar7._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," usec avg for all invokations.  ",0x20);
    auVar9 = vcvtusi2ss_avx512f(in_XMM2,uVar3);
    std::ostream::_M_insert<double>((double)(auVar9._0_4_ / auVar4._0_4_));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," usec (avg) of ",0xf);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," trials",7);
    pOVar5 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(pOVar5,(LogStringBuffer *)local_1b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  return;
}

Assistant:

void FunctionTimer::Print(unsigned trials)
{
    if (trials == 1)
    {
        Logger.Info(FunctionName, " called ", Invokations, " times.  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec, " usec");
    }
    else
    {
        Logger.Info(FunctionName, " called ", Invokations / (float)trials, " times per trial (avg).  ", TotalUsec / (double)Invokations, " usec avg for all invokations.  ", TotalUsec / (float)trials, " usec (avg) of ", trials, " trials");
    }
}